

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O2

Tim_Man_t * Tim_ManReduce(Tim_Man_t *p,Vec_Int_t *vBoxesLeft,int nTermsDiff)

{
  uint uVar1;
  Tim_Obj_t *pTVar2;
  Tim_Obj_t *pTVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Tim_Box_t *pTVar8;
  Tim_Man_t *p_00;
  Vec_Ptr_t *pVVar9;
  float *pfVar10;
  float *Entry;
  ulong uVar11;
  void *pvVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int local_4c;
  
  local_4c = Tim_ManPiNum(p);
  iVar5 = Tim_ManPoNum(p);
  iVar6 = vBoxesLeft->nSize;
  if (p->vBoxes == (Vec_Ptr_t *)0x0) {
    iVar17 = 0;
  }
  else {
    iVar17 = p->vBoxes->nSize;
  }
  if (iVar17 < iVar6) {
    __assert_fail("Vec_IntSize(vBoxesLeft) <= Tim_ManBoxNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                  ,0x107,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
  }
  local_4c = local_4c - nTermsDiff;
  iVar5 = iVar5 - nTermsDiff;
  iVar18 = local_4c;
  iVar17 = iVar5;
  for (iVar16 = 0; iVar16 < iVar6; iVar16 = iVar16 + 1) {
    iVar6 = Vec_IntEntry(vBoxesLeft,iVar16);
    pTVar8 = Tim_ManBox(p,iVar6);
    iVar18 = iVar18 + pTVar8->nOutputs;
    iVar17 = iVar17 + pTVar8->nInputs;
    iVar6 = vBoxesLeft->nSize;
  }
  uVar13 = p->nCis;
  if (iVar18 <= (int)(uVar13 - nTermsDiff)) {
    uVar1 = p->nCos;
    if ((int)(uVar1 - nTermsDiff) < iVar17) {
      __assert_fail("nNewCos <= Tim_ManCoNum(p) - nTermsDiff",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                    ,0x112,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
    }
    lVar14 = 0;
    if ((int)uVar13 < 1) {
      uVar13 = 0;
    }
    while (((ulong)uVar13 * 0x18 - lVar14 != 0 && (p->pCis != (Tim_Obj_t *)0x0))) {
      *(undefined4 *)((long)&p->pCis->TravId + lVar14) = 0;
      lVar14 = lVar14 + 0x18;
    }
    uVar15 = 0;
    uVar11 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar11 = uVar15;
    }
    while ((uVar11 * 0x18 - uVar15 != 0 && (p->pCos != (Tim_Obj_t *)0x0))) {
      *(undefined4 *)((long)&p->pCos->TravId + uVar15) = 0;
      uVar15 = uVar15 + 0x18;
    }
    p_00 = Tim_ManStart(iVar18,iVar17);
    memcpy(p_00->pCis,p->pCis,(long)local_4c * 0x18);
    pTVar2 = p_00->pCos;
    iVar6 = p->nCos;
    pTVar3 = p->pCos;
    iVar18 = Tim_ManPoNum(p);
    memcpy(pTVar2 + ((long)iVar17 - (long)iVar5),pTVar3 + ((long)iVar6 - (long)iVar18),
           (long)iVar5 * 0x18);
    if ((p->vDelayTables != (Vec_Ptr_t *)0x0) && (iVar6 = p->vDelayTables->nSize, 0 < iVar6)) {
      pVVar9 = Vec_PtrStart(iVar6);
      p_00->vDelayTables = pVVar9;
      bVar4 = false;
      for (iVar6 = 0; iVar6 < p->vDelayTables->nSize; iVar6 = iVar6 + 1) {
        pfVar10 = (float *)Vec_PtrEntry(p->vDelayTables,iVar6);
        if (pfVar10 != (float *)0x0) {
          if (!bVar4 && iVar6 != (int)*pfVar10) {
            puts("Warning: Mismatch in delay-table number between the manager and the box.");
            bVar4 = true;
          }
          uVar13 = (int)pfVar10[2] * (int)pfVar10[1];
          Entry = (float *)malloc((long)(int)uVar13 * 4 + 0xc);
          *Entry = (float)iVar6;
          Entry[1] = (float)(int)pfVar10[1];
          Entry[2] = (float)(int)pfVar10[2];
          if ((int)uVar13 < 1) {
            uVar13 = 0;
          }
          for (uVar11 = 0; uVar13 != uVar11; uVar11 = uVar11 + 1) {
            Entry[uVar11 + 3] = pfVar10[uVar11 + 3];
          }
          pvVar12 = Vec_PtrEntry(pVVar9,iVar6);
          if (pvVar12 != (void *)0x0) {
            __assert_fail("Vec_PtrEntry(pNew->vDelayTables, i) == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                          ,0x137,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
          }
          Vec_PtrWriteEntry(pVVar9,iVar6,Entry);
        }
      }
    }
    if ((p->vBoxes != (Vec_Ptr_t *)0x0) && (iVar6 = p->vBoxes->nSize, 0 < iVar6)) {
      pVVar9 = Vec_PtrAlloc(iVar6);
      p_00->vBoxes = pVVar9;
      iVar17 = 0;
      for (iVar6 = 0; iVar6 < vBoxesLeft->nSize; iVar6 = iVar6 + 1) {
        iVar16 = Vec_IntEntry(vBoxesLeft,iVar6);
        pTVar8 = Tim_ManBox(p,iVar16);
        Tim_ManCreateBox(p_00,iVar17,pTVar8->nInputs,local_4c,pTVar8->nOutputs,pTVar8->iDelayTable,
                         pTVar8->fBlack);
        iVar18 = -1;
        if (p_00->vBoxes != (Vec_Ptr_t *)0x0) {
          iVar18 = p_00->vBoxes->nSize + -1;
        }
        iVar7 = Tim_ManBoxCopy(p,iVar16);
        if (iVar7 != -1) {
          iVar16 = Tim_ManBoxCopy(p,iVar16);
        }
        Tim_ManBoxSetCopy(p_00,iVar18,iVar16);
        local_4c = local_4c + pTVar8->nOutputs;
        iVar17 = iVar17 + pTVar8->nInputs;
      }
      if (local_4c != p_00->nCis) {
        __assert_fail("curPi == Tim_ManCiNum(pNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                      ,0x14a,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
      }
      if (iVar17 + iVar5 != p_00->nCos) {
        __assert_fail("curPo == Tim_ManCoNum(pNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                      ,0x14b,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
      }
    }
    return p_00;
  }
  __assert_fail("nNewCis <= Tim_ManCiNum(p) - nTermsDiff",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                ,0x111,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
}

Assistant:

Tim_Man_t * Tim_ManReduce( Tim_Man_t * p, Vec_Int_t * vBoxesLeft, int nTermsDiff )
{
    Tim_Man_t * pNew;
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    float * pDelayTable, * pDelayTableNew;
    int i, k, iBox, nNewCis, nNewCos, nInputs, nOutputs;
    int nNewPiNum = Tim_ManPiNum(p) - nTermsDiff;
    int nNewPoNum = Tim_ManPoNum(p) - nTermsDiff;
    assert( Vec_IntSize(vBoxesLeft) <= Tim_ManBoxNum(p) );
    // count the number of CIs and COs in the trimmed manager
    nNewCis = nNewPiNum;
    nNewCos = nNewPoNum;
    Vec_IntForEachEntry( vBoxesLeft, iBox, i )
    {
        pBox = Tim_ManBox( p, iBox );
        nNewCis += pBox->nOutputs;
        nNewCos += pBox->nInputs;
    }
    assert( nNewCis <= Tim_ManCiNum(p) - nTermsDiff );
    assert( nNewCos <= Tim_ManCoNum(p) - nTermsDiff );
    // clear traversal IDs
    Tim_ManForEachCi( p, pObj, i ) 
        pObj->TravId = 0;          
    Tim_ManForEachCo( p, pObj, i ) 
        pObj->TravId = 0;          
    // create new manager
    pNew = Tim_ManStart( nNewCis, nNewCos );
    // copy box connectivity information
    memcpy( pNew->pCis, p->pCis, sizeof(Tim_Obj_t) * nNewPiNum );
    memcpy( pNew->pCos + nNewCos - nNewPoNum, 
            p->pCos + Tim_ManCoNum(p) - Tim_ManPoNum(p), 
            sizeof(Tim_Obj_t) * nNewPoNum );
    // duplicate delay tables
    if ( Tim_ManDelayTableNum(p) > 0 )
    {
        int fWarning = 0;
        pNew->vDelayTables = Vec_PtrStart( Vec_PtrSize(p->vDelayTables) );
        Tim_ManForEachTable( p, pDelayTable, i )
        {
            if ( pDelayTable == NULL )
                continue;
            if ( i != (int)pDelayTable[0] && fWarning == 0 )
            {
                printf( "Warning: Mismatch in delay-table number between the manager and the box.\n" );
                fWarning = 1;
            }
            //assert( i == (int)pDelayTable[0] );
            nInputs   = (int)pDelayTable[1];
            nOutputs  = (int)pDelayTable[2];
            pDelayTableNew = ABC_ALLOC( float, 3 + nInputs * nOutputs );
            pDelayTableNew[0] = i;//(int)pDelayTable[0];
            pDelayTableNew[1] = (int)pDelayTable[1];
            pDelayTableNew[2] = (int)pDelayTable[2];
            for ( k = 0; k < nInputs * nOutputs; k++ )
                pDelayTableNew[3+k] = pDelayTable[3+k];
//            assert( (int)pDelayTableNew[0] == Vec_PtrSize(pNew->vDelayTables) );
            assert( Vec_PtrEntry(pNew->vDelayTables, i) == NULL );
            Vec_PtrWriteEntry( pNew->vDelayTables, i, pDelayTableNew );
        }
    }
    // duplicate boxes
    if ( Tim_ManBoxNum(p) > 0 )
    {
        int curPi = nNewPiNum;
        int curPo = 0;
        pNew->vBoxes = Vec_PtrAlloc( Tim_ManBoxNum(p) );
        Vec_IntForEachEntry( vBoxesLeft, iBox, i )
        {
            pBox = Tim_ManBox( p, iBox );
            Tim_ManCreateBox( pNew, curPo, pBox->nInputs, curPi, pBox->nOutputs, pBox->iDelayTable, pBox->fBlack );
            Tim_ManBoxSetCopy( pNew, Tim_ManBoxNum(pNew) - 1, Tim_ManBoxCopy(p, iBox) == -1 ? iBox : Tim_ManBoxCopy(p, iBox) );
            curPi += pBox->nOutputs;
            curPo += pBox->nInputs;
        }
        curPo += nNewPoNum;
        assert( curPi == Tim_ManCiNum(pNew) );
        assert( curPo == Tim_ManCoNum(pNew) );
    }
    return pNew;
}